

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall spvtools::opt::CFG::RemoveNonExistingEdges(CFG *this,uint32_t blk_id)

{
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar2;
  BasicBlock *this_01;
  mapped_type *this_02;
  anon_class_16_2_db5cc0cb local_90;
  function<void_(unsigned_int)> local_80;
  bool local_59;
  BasicBlock *pBStack_58;
  bool has_branch;
  BasicBlock *pred_blk;
  const_iterator cStack_48;
  uint32_t id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> updated_pred_list;
  uint32_t blk_id_local;
  CFG *this_local;
  
  updated_pred_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = blk_id;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  this_00 = preds(this,updated_pred_list.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
  cStack_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    pred_blk._4_4_ = *puVar2;
    this_01 = block(this,pred_blk._4_4_);
    local_59 = false;
    local_90.has_branch = &local_59;
    local_90.blk_id =
         updated_pred_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    pBStack_58 = this_01;
    std::function<void(unsigned_int)>::
    function<spvtools::opt::CFG::RemoveNonExistingEdges(unsigned_int)::__0,void>
              ((function<void(unsigned_int)> *)&local_80,&local_90);
    BasicBlock::ForEachSuccessorLabel(this_01,&local_80);
    std::function<void_(unsigned_int)>::~function(&local_80);
    if ((local_59 & 1U) != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,
                 (value_type *)((long)&pred_blk + 4));
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  this_02 = std::
            unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::at(&this->label2preds_,
                 (key_type *)
                 ((long)&updated_pred_list.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (this_02,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  return;
}

Assistant:

void CFG::RemoveNonExistingEdges(uint32_t blk_id) {
  std::vector<uint32_t> updated_pred_list;
  for (uint32_t id : preds(blk_id)) {
    const BasicBlock* pred_blk = block(id);
    bool has_branch = false;
    pred_blk->ForEachSuccessorLabel([&has_branch, blk_id](uint32_t succ) {
      if (succ == blk_id) {
        has_branch = true;
      }
    });
    if (has_branch) updated_pred_list.push_back(id);
  }

  label2preds_.at(blk_id) = std::move(updated_pred_list);
}